

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O2

uint32_t __thiscall
basist::bitwise_decoder::decode_huffman
          (bitwise_decoder *this,huffman_decoding_table *ct,int fast_lookup_bits)

{
  uint *puVar1;
  short *psVar2;
  uint uVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  
  if ((ct->m_code_sizes).m_size != 0) {
    uVar3 = this->m_bit_buf_size;
    uVar6 = this->m_bit_buf;
    pbVar4 = this->m_pBuf;
    while (uVar3 < 0x10) {
      uVar7 = 0;
      pbVar5 = pbVar4;
      if (pbVar4 < this->m_pBuf_end) {
        pbVar5 = pbVar4 + 1;
        this->m_pBuf = pbVar5;
        uVar7 = (uint)*pbVar4;
      }
      uVar6 = uVar6 | uVar7 << ((byte)uVar3 & 0x1f);
      this->m_bit_buf = uVar6;
      uVar3 = uVar3 + 8;
      this->m_bit_buf_size = uVar3;
      pbVar4 = pbVar5;
    }
    puVar1 = (uint *)basisu::vector<int>::operator[]
                               (&ct->m_lookup,
                                (ulong)(uVar6 & ~(-1 << ((byte)fast_lookup_bits & 0x1f))));
    uVar3 = *puVar1;
    if ((int)uVar3 < 0) {
      do {
        uVar6 = fast_lookup_bits + 1;
        psVar2 = basisu::vector<short>::operator[]
                           (&ct->m_tree,
                            (ulong)(~uVar3 + (uint)((this->m_bit_buf >> (fast_lookup_bits & 0x1fU) &
                                                    1) != 0)));
        uVar3 = (uint)*psVar2;
        fast_lookup_bits = uVar6;
      } while (*psVar2 < 0);
    }
    else {
      uVar6 = uVar3 >> 0x10;
      uVar3 = uVar3 & 0xffff;
    }
    this->m_bit_buf = this->m_bit_buf >> ((byte)uVar6 & 0x1f);
    this->m_bit_buf_size = this->m_bit_buf_size - uVar6;
    return uVar3;
  }
  __assert_fail("ct.m_code_sizes.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                ,0x1bf,
                "uint32_t basist::bitwise_decoder::decode_huffman(const huffman_decoding_table &, int)"
               );
}

Assistant:

inline uint32_t decode_huffman(const huffman_decoding_table &ct, int fast_lookup_bits = basisu::cHuffmanFastLookupBits)
		{
			assert(ct.m_code_sizes.size());

			const uint32_t huffman_fast_lookup_size = 1 << fast_lookup_bits;
						
			while (m_bit_buf_size < 16)
			{
				uint32_t c = 0;
				if (m_pBuf < m_pBuf_end)
					c = *m_pBuf++;

				m_bit_buf |= (c << m_bit_buf_size);
				m_bit_buf_size += 8;
				assert(m_bit_buf_size <= 32);
			}
						
			int code_len;

			int sym;
			if ((sym = ct.m_lookup[m_bit_buf & (huffman_fast_lookup_size - 1)]) >= 0)
			{
				code_len = sym >> 16;
				sym &= 0xFFFF;
			}
			else
			{
				code_len = fast_lookup_bits;
				do
				{
					sym = ct.m_tree[~sym + ((m_bit_buf >> code_len++) & 1)]; // ~sym = -sym - 1
				} while (sym < 0);
			}

			m_bit_buf >>= code_len;
			m_bit_buf_size -= code_len;

			return sym;
		}